

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_invis(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  int sn_01;
  CHAR_DATA *in_RDX;
  int in_R8D;
  int sn_fire;
  int sn_fog;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  sn_00 = skill_lookup((char *)in_stack_ffffffffffffff78);
  sn_01 = skill_lookup((char *)in_stack_ffffffffffffff78);
  bVar1 = is_affected(in_RDX,sn_00);
  if ((bVar1) || (bVar1 = is_affected(in_RDX,sn_01), bVar1)) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if (in_R8D == 1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = is_affected_by(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    if (!bVar1) {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (void *)CONCAT44(sn_00,sn_01),0);
      init_affect((AFFECT_DATA *)0x618489);
      std::pow<int,int>(0,0x6184dc);
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (AFFECT_DATA *)CONCAT44(sn_00,sn_01));
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void spell_invis(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;
	int sn_fog, sn_fire;

	sn_fog = skill_lookup("faerie fog");
	sn_fire = skill_lookup("faerie fire");

	if (is_affected(ch, sn_fog) || is_affected(ch, sn_fire))
	{
		send_to_char("You can't turn invisible while glowing.\n\r", ch);
		return;
	}

	if (target == TARGET_OBJ)
	{
		send_to_char("You must be crazy.\n\r", ch);
		return;
	}
	/* character invisibility */
	victim = (CHAR_DATA *)vo;

	if (is_affected_by(victim, AFF_INVISIBLE))
		return;

	act("$n fades out of existence.", victim, nullptr, nullptr, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level + 12;
	af.location = APPLY_NONE;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_INVISIBLE);

	af.mod_name = MOD_VISIBILITY;
	affect_to_char(victim, &af);

	send_to_char("You fade out of existence.\n\r", victim);
}